

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppMemory.h
# Opt level: O3

void __thiscall cppforth::Forth::memFree(Forth *this)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer puVar3;
  void *pvVar4;
  pointer puVar5;
  pointer puVar6;
  pointer puVar7;
  Cell CVar8;
  Cell CVar9;
  Cell CVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  pointer pVVar14;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar15;
  
  requireDStackDepth(this,1,"FREE");
  uVar11 = ForthStack<unsigned_int>::getTop(&this->dStack);
  pVVar1 = (this->VirtualMemory).
           super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (this->VirtualMemory).
           super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar12 = (long)pVVar2 - (long)pVVar1 >> 5;
  uVar13 = uVar12;
  do {
    pVVar14 = pVVar2;
    uVar13 = uVar13 - 1;
    if (uVar13 < 3) {
      uVar11 = 0xffffffc4;
      goto LAB_001159e6;
    }
    pVVar2 = pVVar14 + -1;
  } while (pVVar14[-1].start != uVar11);
  if (this->VirtualMemoryFreeSegment == pVVar14[-1].end) {
    this->VirtualMemoryFreeSegment = uVar11;
  }
  uVar12 = uVar12 - 1;
  if (uVar13 < uVar12) {
    CVar9 = pVVar2->start;
    CVar10 = pVVar2->end;
    puVar3 = pVVar14[-1].segment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    pVVar1 = pVVar1 + uVar12;
    pvVar15 = &pVVar1->segment;
    puVar6 = pVVar14[-1].segment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar7 = pVVar14[-1].segment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pVVar14[-1].segment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pVVar14[-1].segment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pVVar14[-1].segment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    CVar8 = pVVar1->end;
    pVVar2->start = pVVar1->start;
    pVVar2->end = CVar8;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&pVVar14[-1].segment,pvVar15);
    pVVar1->start = CVar9;
    pVVar1->end = CVar10;
    pvVar4 = (pvVar15->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = *(pointer *)
              ((long)&(pVVar1->segment).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
              0x10);
    (pvVar15->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_start = puVar6;
    *(pointer *)
     ((long)&(pVVar1->segment).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl + 8) = puVar7;
    *(pointer *)
     ((long)&(pVVar1->segment).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl + 0x10) = puVar3;
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,(long)puVar5 - (long)pvVar4);
    }
  }
  std::
  vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
  ::resize(&this->VirtualMemory,
           ((long)(this->VirtualMemory).
                  super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->VirtualMemory).
                  super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5) - 1);
  uVar11 = 0;
LAB_001159e6:
  ForthStack<unsigned_int>::setTop(&this->dStack,uVar11);
  return;
}

Assistant:

void memFree() {
			REQUIRE_DSTACK_DEPTH(1, "FREE");
			auto addr = dStack.getTop();
			for (auto i = VirtualMemory.size() - 1; i > vmSegmentDataSpace; --i){
				if (VirtualMemory[i].start == addr){
					if (VirtualMemoryFreeSegment == VirtualMemory[i].end){
						VirtualMemoryFreeSegment = VirtualMemory[i].start;
					}
					if (i < VirtualMemory.size() - 1){
						std::swap(VirtualMemory[i], VirtualMemory[VirtualMemory.size() - 1]);
					}
					VirtualMemory.resize(VirtualMemory.size() - 1);

					dStack.setTop(0);
					return;
				}
			}
			dStack.setTop(CELL(errorFree));
		}